

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

Value * __thiscall
BasicBlock::UpdateValueForCopyTypeInstr
          (BasicBlock *this,GlobOpt *globOpt,GlobHashTable *localSymToValueMap,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  int32 intConst;
  Opnd *pOVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  PropertySym *pPVar6;
  Value *this_00;
  ValueInfo *this_01;
  StackSym *pSVar7;
  Value **ppVVar8;
  Sym *pSVar9;
  IntConstOpnd *this_02;
  Int64ConstOpnd *pIVar10;
  long intConst_00;
  AddrOpnd *addrOpnd;
  SymID local_9c;
  Sym *local_98;
  Value **localValue_2;
  Value **ppVStack_78;
  ValueType src1Value;
  Value **localValue_1;
  Value **localValue;
  StackSym *src1Sym;
  Value **localDstValue;
  PropertySym *prop;
  Sym *objSym;
  Value *objectValue;
  PropertySym *originalPropertySym;
  SymOpnd *symOpnd;
  Value *dstValue;
  Instr *instr_local;
  GlobHashTable *localSymToValueMap_local;
  GlobOpt *globOpt_local;
  BasicBlock *this_local;
  
  symOpnd = (SymOpnd *)0x0;
  if (instr->m_opcode == LdFld) {
    pOVar3 = IR::Instr::GetSrc1(instr);
    bVar2 = IR::Opnd::IsSymOpnd(pOVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x11e9,"(instr->GetSrc1()->IsSymOpnd())","instr->GetSrc1()->IsSymOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pOVar3 = IR::Instr::GetSrc1(instr);
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar3);
    bVar2 = Sym::IsPropertySym(pSVar5->m_sym);
    if (bVar2) {
      pPVar6 = Sym::AsPropertySym(pSVar5->m_sym);
      this_00 = FindValueInLocalThenGlobalValueTableAndUpdate
                          (this,globOpt,localSymToValueMap,instr,(Sym *)0x0,
                           &pPVar6->m_stackSym->super_Sym);
      if (this_00 == (Value *)0x0) {
        local_98 = (Sym *)0x0;
      }
      else {
        this_01 = ::Value::GetValueInfo(this_00);
        local_98 = ValueInfo::GetSymStore(this_01);
      }
      if (local_98 == (Sym *)0x0) {
        local_9c = (pPVar6->m_stackSym->super_Sym).m_id;
      }
      else {
        local_9c = local_98->m_id;
      }
      pPVar6 = PropertySym::Find(local_9c,pPVar6->m_propertyId,globOpt->func);
      if (pPVar6 == (PropertySym *)0x0) {
        pOVar3 = IR::Instr::GetDst(instr);
        pSVar7 = IR::Opnd::GetStackSym(pOVar3);
        ppVVar8 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew
                            (localSymToValueMap,&pSVar7->super_Sym);
        *ppVVar8 = (Value *)0x0;
        symOpnd = (SymOpnd *)0x0;
      }
      else {
        pOVar3 = IR::Instr::GetDst(instr);
        pSVar7 = IR::Opnd::GetStackSym(pOVar3);
        symOpnd = (SymOpnd *)
                  FindValueInLocalThenGlobalValueTableAndUpdate
                            (this,globOpt,localSymToValueMap,instr,&pSVar7->super_Sym,
                             &pPVar6->super_Sym);
      }
    }
  }
  else {
    pOVar3 = IR::Instr::GetSrc1(instr);
    pSVar7 = IR::Opnd::GetStackSym(pOVar3);
    if (pSVar7 == (StackSym *)0x0) {
      pOVar3 = IR::Instr::GetSrc1(instr);
      bVar2 = IR::Opnd::IsIntConstOpnd(pOVar3);
      if (bVar2) {
        pOVar3 = IR::Instr::GetDst(instr);
        pSVar9 = IR::Opnd::GetSym(pOVar3);
        ppVVar8 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
        pOVar3 = IR::Instr::GetSrc1(instr);
        this_02 = IR::Opnd::AsIntConstOpnd(pOVar3);
        intConst = IR::IntConstOpnd::AsInt32(this_02);
        symOpnd = (SymOpnd *)GlobOpt::GetIntConstantValue(globOpt,intConst,instr,(Opnd *)0x0);
        *ppVVar8 = (Value *)symOpnd;
      }
      else {
        pOVar3 = IR::Instr::GetSrc1(instr);
        bVar2 = IR::Opnd::IsInt64ConstOpnd(pOVar3);
        if (bVar2) {
          pOVar3 = IR::Instr::GetDst(instr);
          pSVar9 = IR::Opnd::GetSym(pOVar3);
          ppVStack_78 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
          pOVar3 = IR::Instr::GetSrc1(instr);
          pIVar10 = IR::Opnd::AsInt64ConstOpnd(pOVar3);
          intConst_00 = IR::EncodableOpnd<long>::GetValue(&pIVar10->super_EncodableOpnd<long>);
          symOpnd = (SymOpnd *)GlobOpt::GetIntConstantValue(globOpt,intConst_00,instr,(Opnd *)0x0);
          *ppVStack_78 = (Value *)symOpnd;
        }
        else {
          pOVar3 = IR::Instr::GetSrc1(instr);
          localValue_2._6_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(pOVar3);
          pOVar3 = IR::Instr::GetDst(instr);
          pSVar9 = IR::Opnd::GetSym(pOVar3);
          ppVVar8 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
          bVar2 = ValueType::IsUndefined((ValueType *)((long)&localValue_2 + 6));
          if ((bVar2) ||
             (bVar2 = ValueType::IsBoolean((ValueType *)((long)&localValue_2 + 6)), bVar2)) {
            pOVar3 = IR::Instr::GetSrc1(instr);
            addrOpnd = IR::Opnd::AsAddrOpnd(pOVar3);
            symOpnd = (SymOpnd *)GlobOpt::GetVarConstantValue(globOpt,addrOpnd);
            *ppVVar8 = (Value *)symOpnd;
          }
          else {
            *ppVVar8 = (Value *)0x0;
            symOpnd = (SymOpnd *)0x0;
          }
        }
      }
    }
    else {
      pOVar3 = IR::Instr::GetSrc1(instr);
      pSVar7 = IR::Opnd::GetStackSym(pOVar3);
      pOVar3 = IR::Instr::GetDst(instr);
      pSVar9 = IR::Opnd::GetSym(pOVar3);
      symOpnd = (SymOpnd *)
                FindValueInLocalThenGlobalValueTableAndUpdate
                          (this,globOpt,localSymToValueMap,instr,pSVar9,&pSVar7->super_Sym);
    }
  }
  return (Value *)symOpnd;
}

Assistant:

Value*
BasicBlock::UpdateValueForCopyTypeInstr(GlobOpt* globOpt, GlobHashTable* localSymToValueMap, IR::Instr* instr)
{
    Value* dstValue = nullptr;
    if (instr->m_opcode == Js::OpCode::LdFld)
    {
        // Special handling for LdFld
        Assert(instr->GetSrc1()->IsSymOpnd());
        IR::SymOpnd* symOpnd = instr->GetSrc1()->AsSymOpnd();

        if (symOpnd->m_sym->IsPropertySym())
        {
            PropertySym* originalPropertySym = symOpnd->m_sym->AsPropertySym();
            Value* const objectValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, nullptr, originalPropertySym->m_stackSym);
            Sym* objSym = objectValue ? objectValue->GetValueInfo()->GetSymStore() : nullptr;
            PropertySym* prop = PropertySym::Find(objSym ? objSym->m_id : originalPropertySym->m_stackSym->m_id, originalPropertySym->m_propertyId, globOpt->func);
            if (prop)
            {
                dstValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, instr->GetDst()->GetStackSym(), prop);
            }
            else
            {
                Value** localDstValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetStackSym());
                dstValue = *localDstValue = nullptr;
            }
        }
    }
    else if (instr->GetSrc1()->GetStackSym())
    {
        StackSym* src1Sym = instr->GetSrc1()->GetStackSym();
        dstValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, instr->GetDst()->GetSym(), src1Sym);
    }
    else if (instr->GetSrc1()->IsIntConstOpnd())
    {
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        dstValue = *localValue = globOpt->GetIntConstantValue(instr->GetSrc1()->AsIntConstOpnd()->AsInt32(), instr);
    }
    else if (instr->GetSrc1()->IsInt64ConstOpnd())
    {
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        dstValue = *localValue = globOpt->GetIntConstantValue(instr->GetSrc1()->AsInt64ConstOpnd()->GetValue(), instr);
    }
    else
    {
        ValueType src1Value = instr->GetSrc1()->GetValueType();
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        if (src1Value.IsUndefined() || src1Value.IsBoolean())
        {
            dstValue = *localValue = globOpt->GetVarConstantValue(instr->GetSrc1()->AsAddrOpnd());
        }
        else
        {
            dstValue = *localValue = nullptr;
        }
    }
    return dstValue;
}